

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O2

bool google::protobuf::internal::
     HandleString<google::protobuf::internal::(anonymous_namespace)::UnknownFieldHandler,(google::protobuf::internal::Cardinality)3,false,(google::protobuf::internal::StringType)0>
               (CodedInputStream *input,MessageLite *msg,Arena *arena,uint32 *has_bits,
               uint32 has_bit_index,int64 offset,void *default_ptr,char *field_name)

{
  bool bVar1;
  string *value;
  ArenaStringPtr *this;
  undefined4 in_register_00000084;
  StringPiece local_28;
  
  this = (ArenaStringPtr *)((long)&msg->_vptr_MessageLite + (long)has_bits);
  value = ArenaStringPtr::Mutable(this,(string *)CONCAT44(in_register_00000084,has_bit_index),arena)
  ;
  bVar1 = WireFormatLite::ReadBytes(input,value);
  if (bVar1) {
    StringPiece::StringPiece<std::allocator<char>>(&local_28,this->ptr_);
  }
  return bVar1;
}

Assistant:

static inline bool HandleString(io::CodedInputStream* input, MessageLite* msg,
                                Arena* arena, uint32* has_bits,
                                uint32 has_bit_index, int64 offset,
                                const void* default_ptr,
                                const char* field_name) {
  StringPiece utf8_string_data;
#ifdef GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED
  constexpr bool kValidateUtf8 = is_string_type;
#else
  constexpr bool kValidateUtf8 = false;
#endif  // GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED

  switch (ctype) {
    case StringType_INLINED: {
      InlinedStringField* s = nullptr;
      switch (cardinality) {
        case Cardinality_SINGULAR:
          // TODO(ckennelly): Is this optimal?
          s = MutableField<InlinedStringField>(msg, has_bits, has_bit_index,
                                               offset);
          break;
        case Cardinality_REPEATED:
          s = AddField<InlinedStringField>(msg, offset);
          break;
        case Cardinality_ONEOF:
          s = Raw<InlinedStringField>(msg, offset);
          break;
      }
      GOOGLE_DCHECK(s != nullptr);
      std::string* value = s->MutableNoArena(NULL);
      if (PROTOBUF_PREDICT_FALSE(!WireFormatLite::ReadString(input, value))) {
        return false;
      }
      utf8_string_data = *value;
      break;
    }
    case StringType_STRING: {
      switch (cardinality) {
        case Cardinality_SINGULAR: {
          ArenaStringPtr* field = MutableField<ArenaStringPtr>(
              msg, has_bits, has_bit_index, offset);
          std::string* value = field->Mutable(
              static_cast<const std::string*>(default_ptr), arena);
          if (PROTOBUF_PREDICT_FALSE(
                  !WireFormatLite::ReadString(input, value))) {
            return false;
          }
          utf8_string_data = field->Get();
        } break;
        case Cardinality_REPEATED: {
          std::string* value = AddField<std::string>(msg, offset);
          if (PROTOBUF_PREDICT_FALSE(
                  !WireFormatLite::ReadString(input, value))) {
            return false;
          }
          utf8_string_data = *value;
        } break;
        case Cardinality_ONEOF: {
          ArenaStringPtr* field = Raw<ArenaStringPtr>(msg, offset);
          std::string* value = field->Mutable(
              static_cast<const std::string*>(default_ptr), arena);
          if (PROTOBUF_PREDICT_FALSE(
                  !WireFormatLite::ReadString(input, value))) {
            return false;
          }
          utf8_string_data = field->Get();
        } break;
        default:
          PROTOBUF_ASSUME(false);
      }
      break;
    }
    default:
      PROTOBUF_ASSUME(false);
  }

  if (kValidateUtf8) {
    // TODO(b/118759213): fail if proto3
    WireFormatLite::VerifyUtf8String(utf8_string_data.data(),
                                     utf8_string_data.length(),
                                     WireFormatLite::PARSE, field_name);
  }
  return true;
}